

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vec4 __thiscall tcu::linearToSRGB(tcu *this,Vec4 *cl)

{
  float *pfVar1;
  float x_;
  float y_;
  float z_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar2;
  Vec4 VVar3;
  Vec4 *cl_local;
  
  pfVar1 = Vector<float,_4>::operator[](cl,0);
  x_ = linearChannelToSRGB(*pfVar1);
  pfVar1 = Vector<float,_4>::operator[](cl,1);
  y_ = linearChannelToSRGB(*pfVar1);
  pfVar1 = Vector<float,_4>::operator[](cl,2);
  z_ = linearChannelToSRGB(*pfVar1);
  pfVar1 = Vector<float,_4>::operator[](cl,3);
  uVar2 = (ulong)(uint)y_;
  Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,*pfVar1);
  VVar3.m_data[2] = (float)(int)uVar2;
  VVar3.m_data[3] = (float)(int)(uVar2 >> 0x20);
  VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 linearToSRGB (const Vec4& cl)
{
	return Vec4(linearChannelToSRGB(cl[0]),
				linearChannelToSRGB(cl[1]),
				linearChannelToSRGB(cl[2]),
				cl[3]);
}